

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)1>_>::ParticleTest_Assignment_Test
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  ParticleTest<pica::Particle<(pica::Dimension)1>_>::ParticleTest
            (&this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>);
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__Test_001f75a8;
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}